

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  ulong uVar2;
  quint16 value;
  int iVar3;
  quint16 *dest;
  long count;
  long in_FS_OFFSET;
  quint16 c16;
  quint32 c32;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = rasterBuffer->format;
  c32 = QRgba64::toArgb32(color);
  c16 = 0xaaaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            ((uchar *)&c16,&c32,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  value = c16;
  uVar2 = rasterBuffer->bytes_per_line;
  dest = (quint16 *)(rasterBuffer->m_buffer + (long)y * uVar2 + (long)x * 2);
  count = (long)width;
  if ((uVar2 & 0xffffffff) == count * 2) {
    qt_memfill16(dest,c16,height * count);
  }
  else {
    iVar3 = 0;
    if (0 < height) {
      iVar3 = height;
    }
    while (iVar3 != 0) {
      qt_memfill16(dest,value,count);
      dest = (quint16 *)((long)dest + uVar2);
      iVar3 = iVar3 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint16 c16;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c16), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint16>(reinterpret_cast<quint16 *>(rasterBuffer->buffer()),
                         c16, x, y, width, height, rasterBuffer->bytesPerLine());
}